

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O3

bool __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateExternalSolution
          (Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,string *solution)

{
  int iVar1;
  char *in_RAX;
  bool bVar2;
  char *tailptr;
  char *local_18;
  
  this->validate = true;
  local_18 = in_RAX;
  std::__cxx11::string::_M_assign((string *)&this->validatesolution);
  iVar1 = std::__cxx11::string::compare((char *)solution);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)solution);
    if (iVar1 != 0) {
      strtod((solution->_M_dataplus)._M_p,&local_18);
      bVar2 = *local_18 == '\0';
    }
  }
  return bVar2;
}

Assistant:

bool Validation<R>::updateExternalSolution(const std::string& solution)
{
   validate = true;
   validatesolution = solution;

   if(solution == "+infinity")
   {
      return true;
   }
   else if(solution == "-infinity")
   {
      return true;
   }
   else
   {
      char* tailptr;
      strtod(solution.c_str(), &tailptr);

      if(*tailptr)
      {
         //conversion failed because the input wasn't a number
         return false;
      }
   }

   return true;
}